

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::EAMAtomTypesSectionParser::parseEAMArray
          (EAMAtomTypesSectionParser *this,istream *input,
          vector<double,_std::allocator<double>_> *array,int num)

{
  long *plVar1;
  int in_ECX;
  StringTokenizer *in_RDX;
  char *in_RSI;
  int i;
  StringTokenizer tokenizer;
  int lineCount;
  char buffer [65535];
  int bufferSize;
  int nlinesToRead;
  int dataPerLine;
  errorStruct *in_stack_fffffffffffefed8;
  StringTokenizer *in_stack_fffffffffffefee0;
  undefined4 in_stack_fffffffffffefef0;
  int in_stack_fffffffffffefef4;
  bool bStack_100f1;
  string *in_stack_fffffffffffeff10;
  int in_stack_fffffffffffeff18;
  undefined4 in_stack_fffffffffffeff1c;
  StringTokenizer *in_stack_fffffffffffeff20;
  allocator<char> aStack_100a9;
  string asStack_100a8 [124];
  int iStack_1002c;
  undefined1 auStack_10028 [65576];
  
  iStack_1002c = 0;
  while( true ) {
    bStack_100f1 = false;
    if (iStack_1002c < in_ECX / 5) {
      plVar1 = (long *)std::istream::getline(in_RSI,(long)auStack_10028);
      bStack_100f1 = std::ios::operator_cast_to_bool
                               ((ios *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    }
    if (bStack_100f1 == false) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffeff20->tokenString_,
               (char *)CONCAT44(in_stack_fffffffffffeff1c,in_stack_fffffffffffeff18),
               (allocator<char> *)in_stack_fffffffffffeff10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffeff20->tokenString_,
               (char *)CONCAT44(in_stack_fffffffffffeff1c,in_stack_fffffffffffeff18),
               (allocator<char> *)in_stack_fffffffffffeff10);
    StringTokenizer::StringTokenizer
              (in_stack_fffffffffffeff20,
               (string *)CONCAT44(in_stack_fffffffffffeff1c,in_stack_fffffffffffeff18),
               in_stack_fffffffffffeff10);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffeff20);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffeff1f);
    std::__cxx11::string::~string(asStack_100a8);
    std::allocator<char>::~allocator(&aStack_100a9);
    in_stack_fffffffffffefef4 =
         StringTokenizer::countTokens
                   ((StringTokenizer *)CONCAT44(in_stack_fffffffffffefef4,in_stack_fffffffffffefef0)
                   );
    if (in_stack_fffffffffffefef4 < 5) {
      in_stack_fffffffffffefed8 = &painCave;
      snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Not enough tokens\n");
      in_stack_fffffffffffefed8->isFatal = 1;
      simError();
    }
    else {
      for (in_stack_fffffffffffeff18 = 0; in_stack_fffffffffffeff18 < 5;
          in_stack_fffffffffffeff18 = in_stack_fffffffffffeff18 + 1) {
        in_stack_fffffffffffefee0 = in_RDX;
        in_stack_fffffffffffeff10 =
             (string *)StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffeff20);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffefee0,
                   (value_type_conflict2 *)in_stack_fffffffffffefed8);
      }
    }
    iStack_1002c = iStack_1002c + 1;
    StringTokenizer::~StringTokenizer(in_stack_fffffffffffefee0);
  }
  if (iStack_1002c < in_ECX / 5) {
    snprintf(painCave.errMsg,2000,"EAMAtomTypesSectionParser Error: Not enough lines to read\n");
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

void EAMAtomTypesSectionParser::parseEAMArray(istream& input,
                                                std::vector<RealType>& array,
                                                int num) {
    const int dataPerLine = 5;
    if (num % dataPerLine != 0) {}

    int nlinesToRead = num / dataPerLine;

    const int bufferSize = 65535;
    char buffer[bufferSize];
    int lineCount = 0;

    while (lineCount < nlinesToRead && input.getline(buffer, bufferSize)) {
      StringTokenizer tokenizer(buffer);
      if (tokenizer.countTokens() >= dataPerLine) {
        for (int i = 0; i < dataPerLine; ++i) {
          array.push_back(tokenizer.nextTokenAsDouble());
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "EAMAtomTypesSectionParser Error: "
                 "Not enough tokens\n");
        painCave.isFatal = 1;
        simError();
      }
      ++lineCount;
    }

    if (lineCount < nlinesToRead) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAtomTypesSectionParser Error: "
               "Not enough lines to read\n");
      painCave.isFatal = 1;
      simError();
    }
  }